

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O3

void __thiscall translate::translate(translate *this,shared_ptr<hittable> *object,vec3 *offset)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR__translate_0011ec18;
  (this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->offset).e[2] = offset->e[2];
  dVar7 = offset->e[1];
  (this->offset).e[0] = offset->e[0];
  (this->offset).e[1] = dVar7;
  *(undefined4 *)&(this->bbox).x.min = 0;
  *(undefined4 *)((long)&(this->bbox).x.min + 4) = 0x7ff00000;
  *(undefined4 *)&(this->bbox).x.max = 0;
  *(undefined4 *)((long)&(this->bbox).x.max + 4) = 0xfff00000;
  *(undefined4 *)&(this->bbox).y.min = 0;
  *(undefined4 *)((long)&(this->bbox).y.min + 4) = 0x7ff00000;
  *(undefined4 *)&(this->bbox).y.max = 0;
  *(undefined4 *)((long)&(this->bbox).y.max + 4) = 0xfff00000;
  *(undefined4 *)&(this->bbox).z.min = 0;
  *(undefined4 *)((long)&(this->bbox).z.min + 4) = 0x7ff00000;
  *(undefined4 *)&(this->bbox).z.max = 0;
  *(undefined4 *)((long)&(this->bbox).z.max + 4) = 0xfff00000;
  (*((object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_hittable[3])
            (&local_48);
  local_48 = offset->e[0] + local_48;
  dStack_40 = offset->e[0] + dStack_40;
  uVar3 = (uint)(dStack_40 - local_48 < 0.0001);
  dVar6 = offset->e[1];
  auVar8._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
  auVar8._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar8._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  dVar7 = offset->e[2];
  (this->bbox).x.min =
       (double)(~auVar8._0_8_ & (ulong)local_48 | (ulong)(local_48 + -5e-05) & auVar8._0_8_);
  (this->bbox).x.max =
       (double)(~auVar8._8_8_ & (ulong)dStack_40 | (ulong)(dStack_40 + 5e-05) & auVar8._8_8_);
  local_38 = dVar6 + local_38;
  dVar6 = dVar6 + dStack_30;
  local_28 = dVar7 + local_28;
  dVar7 = dVar7 + dStack_20;
  uVar4 = -(ulong)(dVar7 - local_28 < 0.0001);
  uVar5 = -(ulong)(dVar6 - local_38 < 0.0001);
  (this->bbox).y.min = (double)(~uVar5 & (ulong)local_38 | (ulong)(local_38 + -5e-05) & uVar5);
  (this->bbox).y.max = (double)(~uVar5 & (ulong)dVar6 | (ulong)(dVar6 + 5e-05) & uVar5);
  uVar5 = (ulong)(dVar7 + 5e-05) & uVar4;
  auVar9._0_8_ = ~uVar4 & (ulong)local_28;
  auVar9._8_8_ = ~uVar4 & (ulong)dVar7;
  auVar2._8_4_ = (int)uVar5;
  auVar2._0_8_ = (ulong)(local_28 + -5e-05) & uVar4;
  auVar2._12_4_ = (int)(uVar5 >> 0x20);
  (this->bbox).z = (interval)(auVar9 | auVar2);
  return;
}

Assistant:

translate(shared_ptr<hittable> object, const vec3& offset)
      : object(object), offset(offset)
    {
        bbox = object->bounding_box() + offset;
    }